

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O0

ReadFileResult __thiscall
cmCTestResourceSpec::ReadFromJSONFile(cmCTestResourceSpec *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  int local_298;
  ReadFileResult result;
  TopVersion version;
  CharReaderBuilder builder;
  Value root;
  long local_228;
  ifstream fin;
  string *filename_local;
  cmCTestResourceSpec *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    Json::Value::Value((Value *)&builder.settings_.limit_,nullValue);
    Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)&version);
    bVar2 = Json::parseFromStream
                      ((Factory *)&version,(IStream *)&local_228,(Value *)&builder.settings_.limit_,
                       (String *)0x0);
    if (bVar2) {
      anon_unknown.dwarf_1410a4d::TopVersion::TopVersion((TopVersion *)&stack0xfffffffffffffd68);
      this_local._4_4_ =
           cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
           Object<(anonymous_namespace)::TopVersion>::operator()
                     ((Object<(anonymous_namespace)::TopVersion> *)
                      (anonymous_namespace)::RootVersionHelper,
                      (TopVersion *)&stack0xfffffffffffffd68,(Value *)&builder.settings_.limit_);
      if (this_local._4_4_ == READ_OK) {
        if ((local_298 == 1) && (result == READ_OK)) {
          this_local._4_4_ =
               cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<cmCTestResourceSpec>
               ::operator()((Object<cmCTestResourceSpec> *)(anonymous_namespace)::RootHelper,this,
                            (Value *)&builder.settings_.limit_);
        }
        else {
          this_local._4_4_ = UNSUPPORTED_VERSION;
        }
      }
    }
    else {
      this_local._4_4_ = JSON_PARSE_ERROR;
    }
    Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)&version);
    Json::Value::~Value((Value *)&builder.settings_.limit_);
  }
  else {
    this_local._4_4_ = FILE_NOT_FOUND;
  }
  std::ifstream::~ifstream(&local_228);
  return this_local._4_4_;
}

Assistant:

cmCTestResourceSpec::ReadFileResult cmCTestResourceSpec::ReadFromJSONFile(
  const std::string& filename)
{
  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    return ReadFileResult::FILE_NOT_FOUND;
  }

  Json::Value root;
  Json::CharReaderBuilder builder;
  if (!Json::parseFromStream(builder, fin, &root, nullptr)) {
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  TopVersion version;
  ReadFileResult result;
  if ((result = RootVersionHelper(version, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }
  if (version.Version.Major != 1 || version.Version.Minor != 0) {
    return ReadFileResult::UNSUPPORTED_VERSION;
  }

  return RootHelper(*this, &root);
}